

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

int Gia_RsbFindNodeToRemove(Gia_RsbMan_t *p,int *pMinCost)

{
  int iVar1;
  int local_28;
  int Cost;
  int CostMin;
  int iMin;
  int iObj;
  int i;
  int *pMinCost_local;
  Gia_RsbMan_t *p_local;
  
  Cost = -1;
  local_28 = 1000000000;
  for (iMin = 0; iVar1 = Vec_IntSize(p->vObjs), iMin < iVar1; iMin = iMin + 1) {
    Vec_IntEntry(p->vObjs,iMin);
    iVar1 = Gia_RsbRemovalCost(p,iMin);
    if (iVar1 < local_28) {
      Cost = iMin;
      local_28 = iVar1;
    }
  }
  if (pMinCost != (int *)0x0) {
    *pMinCost = local_28;
  }
  return Cost;
}

Assistant:

int Gia_RsbFindNodeToRemove( Gia_RsbMan_t * p, int * pMinCost )
{
    int i, iObj, iMin = -1, CostMin = ABC_INFINITY;
    Vec_IntForEachEntry( p->vObjs, iObj, i )
    {
        int Cost = Gia_RsbRemovalCost( p, i );
        if ( CostMin > Cost )
        {
            CostMin = Cost;
            iMin = i;
        }
    }
    if ( pMinCost )
        *pMinCost = CostMin;
    return iMin;
}